

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.cpp
# Opt level: O0

void constructor(void)

{
  mapped_type *pmVar1;
  iterator first_00;
  iterator last;
  allocator local_101;
  undefined1 local_100 [8];
  vector_map<char,_int,_bool_(*)(char,_char),_eastl::allocator> fifth;
  _func_bool_char_char *fn_pt;
  undefined1 local_c8 [8];
  vector_map<char,_int,_classcomp,_eastl::allocator> fourth;
  vector_map<char,_int,_eastl::less<char>,_eastl::allocator> third;
  undefined1 local_70 [8];
  vector_map<char,_int,_eastl::less<char>,_eastl::allocator> second;
  key_type local_33;
  allocator local_32;
  key_compare local_31;
  undefined1 local_30 [8];
  vector_map<char,_int,_eastl::less<char>,_eastl::allocator> first;
  
  eastl::allocator::allocator(&local_32,"EASTL vector");
  eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::vector_map
            ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,&local_31,
             &local_32);
  local_33 = 'a';
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      &local_33);
  *pmVar1 = 10;
  second._35_1_ = 0x62;
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      &second.field_0x23);
  *pmVar1 = 0x1e;
  second._34_1_ = 99;
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      &second.field_0x22);
  *pmVar1 = 0x32;
  second._33_1_ = 100;
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      &second.field_0x21);
  *pmVar1 = 0x46;
  first_00 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::begin
                       ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
  last = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::end
                   ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
  eastl::allocator::allocator((allocator *)&third.field_0x26,"EASTL vector");
  eastl::vector_map<char,int,eastl::less<char>,eastl::allocator>::vector_map<eastl::pair<char,int>*>
            ((vector_map<char,int,eastl::less<char>,eastl::allocator> *)local_70,first_00,last,
             (key_compare *)&third.field_0x27,(allocator_type *)&third.field_0x26);
  eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::vector_map
            ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)&fourth.field_0x20,
             (vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_70);
  eastl::allocator::allocator((allocator *)((long)&fn_pt + 6),"EASTL vector");
  eastl::vector_map<char,_int,_classcomp,_eastl::allocator>::vector_map
            ((vector_map<char,_int,_classcomp,_eastl::allocator> *)local_c8,
             (key_compare *)((long)&fn_pt + 7),(allocator_type *)((long)&fn_pt + 6));
  fifth.m_cmp.m_cmp = fncomp;
  eastl::allocator::allocator(&local_101,"EASTL vector");
  eastl::vector_map<char,_int,_bool_(*)(char,_char),_eastl::allocator>::vector_map
            ((vector_map<char,_int,_bool_(*)(char,_char),_eastl::allocator> *)local_100,
             &fifth.m_cmp.m_cmp,&local_101);
  eastl::vector_map<char,_int,_bool_(*)(char,_char),_eastl::allocator>::~vector_map
            ((vector_map<char,_int,_bool_(*)(char,_char),_eastl::allocator> *)local_100);
  eastl::vector_map<char,_int,_classcomp,_eastl::allocator>::~vector_map
            ((vector_map<char,_int,_classcomp,_eastl::allocator> *)local_c8);
  eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::~vector_map
            ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)&fourth.field_0x20);
  eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::~vector_map
            ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_70);
  eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::~vector_map
            ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
  return;
}

Assistant:

static void constructor() {
  eastl::vector_map<char, int> first;

  first['a']=10;
  first['b']=30;
  first['c']=50;
  first['d']=70;

  eastl::vector_map<char, int> second(first.begin(),first.end());

  eastl::vector_map<char, int> third (second);

  eastl::vector_map<char,int, classcomp> fourth;                 // class as Compare

  bool(*fn_pt)(char,char) = fncomp;
  eastl::vector_map<char,int,bool(*)(char, char)> fifth (fn_pt); // function pointer as Compare
}